

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
pg::ZLKPPSolver::get_nodes_of_max_priority
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ZLKPPSolver *this,
          int max_priority)

{
  iterator __position;
  Game *pGVar1;
  long lVar2;
  uint uVar3;
  uint *puVar4;
  int local_24;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->cur_num_nodes != 0) {
    local_24 = this->cur_nodes_prev[this->cur_first_node];
    lVar2 = (long)local_24;
    pGVar1 = (this->super_Solver).game;
    if (pGVar1->_priority[lVar2] == max_priority) {
      do {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_24)
          ;
          pGVar1 = (this->super_Solver).game;
        }
        else {
          *__position._M_current = (int)lVar2;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar3 = pGVar1->_outedges[pGVar1->_firstouts[local_24]];
        if ((int)uVar3 < 0) {
LAB_0016fc3d:
          __assert_fail("*ptr2 >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/zlkpp.cpp"
                        ,0x80,"std::vector<int> pg::ZLKPPSolver::get_nodes_of_max_priority(int)");
        }
        puVar4 = (uint *)(pGVar1->_outedges + (long)pGVar1->_firstouts[local_24] + 1);
        while (this->cur_nodes_bm[uVar3] != true) {
          uVar3 = *puVar4;
          puVar4 = puVar4 + 1;
          if ((int)uVar3 < 0) goto LAB_0016fc3d;
        }
        this->strategy[local_24] = uVar3;
        if (local_24 == this->cur_first_node) {
          return __return_storage_ptr__;
        }
        local_24 = this->cur_nodes_prev[local_24];
        lVar2 = (long)local_24;
      } while (pGVar1->_priority[lVar2] == max_priority);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ZLKPPSolver::get_nodes_of_max_priority(int max_priority) {
    std::vector<int> top;
    if (!cur_num_nodes)
        return top;
    int v = cur_nodes_prev[cur_first_node];
    while (priority(v) == max_priority) {
        top.push_back(v);
        const int *ptr2 = outs(v);
        for (;; ++ptr2) {
            assert(*ptr2 >= 0);
            if (cur_nodes_bm[*ptr2])
                break;
        }
        strategy[v] = *ptr2; // we can go to an arbitrary node that is currently in the game
        if (v == cur_first_node)
            break;
        v = cur_nodes_prev[v];
    }
    return top; // the returned vector is sorted
}